

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O1

void __thiscall
TasGrid::TasmanianSparseGrid::makeWaveletGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,int order,
          vector<int,_std::allocator<int>_> *level_limits)

{
  pointer piVar1;
  pointer piVar2;
  BaseCanonicalGrid *pBVar3;
  BaseCanonicalGrid *pBVar4;
  long *plVar5;
  invalid_argument *piVar6;
  long *plVar7;
  string message;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  BaseCanonicalGrid *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_88 = order;
  local_84 = depth;
  local_80 = outputs;
  local_7c = dimensions;
  if (dimensions < 1) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeWaveletGrid() requires positive dimensions");
  }
  else if (outputs < 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeWaveletGrid() requires non-negative outputs");
  }
  else if (depth < 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeWaveletGrid() requires non-negative depth");
  }
  else {
    if ((order & 0xfffffffdU) != 1) {
      ::std::__cxx11::to_string(&local_38,order);
      ::std::operator+(&local_58,"ERROR: makeWaveletGrid() is called with order: ",&local_38);
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_58);
      local_78 = (BaseCanonicalGrid *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_78 == (BaseCanonicalGrid *)plVar7) {
        local_68 = *plVar7;
        lStack_60 = plVar5[3];
        local_78 = (BaseCanonicalGrid *)&local_68;
      }
      else {
        local_68 = *plVar7;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument(piVar6,(string *)&local_78);
      __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
    piVar1 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((piVar1 == piVar2) || ((long)piVar2 - (long)piVar1 >> 2 == (ulong)(uint)dimensions)) {
      clear(this);
      ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
      local_58._M_dataplus._M_p =
           (pointer)(this->acceleration)._M_t.
                    super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                    .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl;
      Utils::
      make_unique<TasGrid::GridWavelet,TasGrid::AccelerationContext*,int&,int&,int&,int&,std::vector<int,std::allocator<int>>&>
                ((Utils *)&local_78,(AccelerationContext **)&local_58,&local_7c,&local_80,&local_84,
                 &local_88,&this->llimits);
      pBVar4 = local_78;
      local_78 = (BaseCanonicalGrid *)0x0;
      pBVar3 = (this->base)._M_t.
               super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
      (this->base)._M_t.
      super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
      .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl = pBVar4;
      if (pBVar3 != (BaseCanonicalGrid *)0x0) {
        (*pBVar3->_vptr_BaseCanonicalGrid[1])();
      }
      if (local_78 != (BaseCanonicalGrid *)0x0) {
        (**(code **)(*(long *)local_78 + 8))();
      }
      return;
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,
               "ERROR: makeWaveletGrid() requires level_limits with either 0 or dimensions entries")
    ;
  }
  __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void TasmanianSparseGrid::makeWaveletGrid(int dimensions, int outputs, int depth, int order, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeWaveletGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeWaveletGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeWaveletGrid() requires non-negative depth");
    if ((order != 1) && (order != 3)){
        std::string message = "ERROR: makeWaveletGrid() is called with order: " + std::to_string(order) + ", but wavelets are implemented only for orders 1 and 3.";
        throw std::invalid_argument(message);
    }
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeWaveletGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = Utils::make_unique<GridWavelet>(acceleration.get(), dimensions, outputs, depth, order, llimits);
}